

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.c
# Opt level: O0

int zero_segment_mix(mixed_segment *segment)

{
  uint32_t local_24;
  float *pfStack_20;
  uint32_t frames;
  float *buffer;
  mixed_buffer *data;
  mixed_segment *segment_local;
  
  buffer = (float *)segment->data;
  local_24 = 0xffffffff;
  data = (mixed_buffer *)segment;
  mixed_buffer_request_write(&stack0xffffffffffffffe0,&local_24,(mixed_buffer *)buffer);
  memset(pfStack_20,0,(ulong)local_24 << 2);
  mixed_buffer_finish_write(local_24,(mixed_buffer *)buffer);
  return 1;
}

Assistant:

int zero_segment_mix(struct mixed_segment *segment){
  struct mixed_buffer *data = (struct mixed_buffer *)segment->data;
  float *restrict buffer;
  uint32_t frames = UINT32_MAX;
  mixed_buffer_request_write(&buffer, &frames, data);
  memset(buffer, 0, frames*sizeof(float));
  mixed_buffer_finish_write(frames, data);
  return 1;
}